

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O0

void __thiscall
FDrawInfo::AddOtherCeilingPlane(FDrawInfo *this,int sector,gl_subsectorrendernode *node)

{
  gl_subsectorrendernode **ppgVar1;
  uint local_28;
  int i;
  int oldcnt;
  gl_subsectorrendernode *node_local;
  int sector_local;
  FDrawInfo *this_local;
  
  local_28 = TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::Size
                       (&this->otherceilingplanes);
  if ((int)local_28 <= sector) {
    TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::Resize
              (&this->otherceilingplanes,sector + 1);
    for (; (int)local_28 <= sector; local_28 = local_28 + 1) {
      ppgVar1 = TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::operator[]
                          (&this->otherceilingplanes,(long)(int)local_28);
      *ppgVar1 = (gl_subsectorrendernode *)0x0;
    }
  }
  ppgVar1 = TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::operator[]
                      (&this->otherceilingplanes,(long)sector);
  node->next = *ppgVar1;
  ppgVar1 = TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::operator[]
                      (&this->otherceilingplanes,(long)sector);
  *ppgVar1 = node;
  return;
}

Assistant:

void FDrawInfo::AddOtherCeilingPlane(int sector, gl_subsectorrendernode * node)
{
	int oldcnt = otherceilingplanes.Size();

	if (oldcnt<=sector)
	{
		otherceilingplanes.Resize(sector+1);
		for(int i=oldcnt;i<=sector;i++) otherceilingplanes[i]=NULL;
	}
	node->next = otherceilingplanes[sector];
	otherceilingplanes[sector] = node;
}